

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

coeff_buf * __thiscall
jpgd::jpeg_decoder::coeff_buf_open
          (jpeg_decoder *this,int block_num_x,int block_num_y,int block_len_x,int block_len_y)

{
  int iVar1;
  coeff_buf *pcVar2;
  uint8 *puVar3;
  
  pcVar2 = (coeff_buf *)alloc(this,0x20,false);
  pcVar2->block_num_x = block_num_x;
  pcVar2->block_num_y = block_num_y;
  pcVar2->block_len_x = block_len_x;
  pcVar2->block_len_y = block_len_y;
  iVar1 = block_len_x * block_len_y * 2;
  pcVar2->block_size = iVar1;
  puVar3 = (uint8 *)alloc(this,(long)(block_num_y * block_num_x * iVar1),true);
  pcVar2->pData = puVar3;
  return pcVar2;
}

Assistant:

jpeg_decoder::coeff_buf* jpeg_decoder::coeff_buf_open(int block_num_x, int block_num_y, int block_len_x, int block_len_y)
	{
		coeff_buf* cb = (coeff_buf*)alloc(sizeof(coeff_buf));

		cb->block_num_x = block_num_x;
		cb->block_num_y = block_num_y;
		cb->block_len_x = block_len_x;
		cb->block_len_y = block_len_y;
		cb->block_size = (block_len_x * block_len_y) * sizeof(jpgd_block_coeff_t);
		cb->pData = (uint8*)alloc(cb->block_size * block_num_x * block_num_y, true);
		return cb;
	}